

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O3

event * helix::make_ob_event
                  (event *__return_storage_ptr__,string *symbol,uint64_t timestamp,order_book *ob,
                  event_mask mask)

{
  pointer pcVar1;
  
  __return_storage_ptr__->_mask = mask | 1;
  (__return_storage_ptr__->_symbol)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_symbol).field_2;
  pcVar1 = (symbol->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->_symbol,pcVar1,pcVar1 + symbol->_M_string_length);
  __return_storage_ptr__->_timestamp = timestamp;
  __return_storage_ptr__->_ob = ob;
  __return_storage_ptr__->_trade = (trade *)0x0;
  return __return_storage_ptr__;
}

Assistant:

event make_ob_event(const std::string& symbol, uint64_t timestamp, order_book* ob, event_mask mask)
{
    return event{mask | ev_order_book_update, symbol, timestamp, ob, nullptr};
}